

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O0

int Abc_ZddMinUnion(Abc_ZddMan *p,int a,int b)

{
  int iVar1;
  int Var;
  Abc_ZddObj *pAVar2;
  Abc_ZddObj *pAVar3;
  uint local_38;
  int r;
  int r1;
  int r0;
  Abc_ZddObj *B;
  Abc_ZddObj *A;
  int b_local;
  int a_local;
  Abc_ZddMan *p_local;
  
  p_local._4_4_ = b;
  if (((a != 0) && (p_local._4_4_ = a, b != 0)) && (a != b)) {
    if (b < a) {
      p_local._4_4_ = Abc_ZddMinUnion(p,b,a);
    }
    else {
      p_local._4_4_ = Abc_ZddCacheLookup(p,a,b,3);
      if (p_local._4_4_ < 0) {
        pAVar2 = Abc_ZddNode(p,a);
        pAVar3 = Abc_ZddNode(p,b);
        if ((*(uint *)pAVar2 & 0x7fffffff) < (*(uint *)pAVar3 & 0x7fffffff)) {
          r = Abc_ZddMinUnion(p,pAVar2->False,b);
          local_38 = pAVar2->True;
        }
        else if ((*(uint *)pAVar3 & 0x7fffffff) < (*(uint *)pAVar2 & 0x7fffffff)) {
          r = Abc_ZddMinUnion(p,a,pAVar3->False);
          local_38 = pAVar3->True;
        }
        else {
          r = Abc_ZddMinUnion(p,pAVar2->False,pAVar3->False);
          local_38 = Abc_ZddMinUnion(p,pAVar2->True,pAVar3->True);
        }
        iVar1 = Abc_ZddDiff(p,local_38,r);
        Var = Abc_MinInt(*(uint *)pAVar2 & 0x7fffffff,*(uint *)pAVar3 & 0x7fffffff);
        iVar1 = Abc_ZddUniqueCreate(p,Var,iVar1,r);
        p_local._4_4_ = Abc_ZddCacheInsert(p,a,b,3,iVar1);
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int Abc_ZddMinUnion( Abc_ZddMan * p, int a, int b )
{
    Abc_ZddObj * A, * B; 
    int r0, r1, r;
    if ( a == 0 ) return b;
    if ( b == 0 ) return a;
    if ( a == b ) return a;
    if ( a > b )  return Abc_ZddMinUnion( p, b, a );
    if ( (r = Abc_ZddCacheLookup(p, a, b, ABC_ZDD_OPER_MIN_UNION)) >= 0 )
        return r;
    A = Abc_ZddNode( p, a );
    B = Abc_ZddNode( p, b );
    if ( A->Var < B->Var )
        r0 = Abc_ZddMinUnion( p, A->False, b ), 
        r1 = A->True;
    else if ( A->Var > B->Var )
        r0 = Abc_ZddMinUnion( p, a, B->False ), 
        r1 = B->True;
    else
        r0 = Abc_ZddMinUnion( p, A->False, B->False ), 
        r1 = Abc_ZddMinUnion( p, A->True, B->True );
    r1 = Abc_ZddDiff( p, r1, r0 ); // assume args are minimal
    r = Abc_ZddUniqueCreate( p, Abc_MinInt(A->Var, B->Var), r1, r0 );
    return Abc_ZddCacheInsert( p, a, b, ABC_ZDD_OPER_MIN_UNION, r );
}